

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O3

int asio_service_test::auto_quorum_size_election_test(void)

{
  __int_type_conflict _Var1;
  long lVar2;
  element_type *peVar3;
  undefined1 *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  int __how;
  int extraout_EDX;
  int extraout_EDX_00;
  int __how_00;
  size_t ii;
  unsigned_long __val;
  __int_type_conflict _Var8;
  int __fd;
  int __how_01;
  TestSm *with;
  char *pcVar9;
  ostream *poVar10;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<RaftAsioPkg_*> __l_02;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_03;
  buffer_serializer bs;
  shared_ptr<RaftAsioPkg> s2;
  ptr<buffer> msg_2;
  ptr<buffer> msg;
  shared_ptr<RaftAsioPkg> s1;
  buffer_serializer bs_2;
  RaftAsioPkg s1_new;
  string s1_addr;
  string s2_addr;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  raft_params params;
  init_options local_328;
  RaftAsioPkg *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  shared_ptr<nuraft::buffer> local_2e8;
  allocator_type local_2d1;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_2d0;
  RaftAsioPkg *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2b0;
  buffer_serializer local_2a8;
  shared_ptr<nuraft::buffer> local_290;
  undefined1 local_280 [8];
  undefined1 local_278 [8];
  undefined1 auStack_270 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [4];
  raft_server *local_218;
  undefined2 local_188;
  bool local_186;
  element_type *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_178;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> local_120;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  undefined1 local_c8 [24];
  thread local_b0;
  undefined1 local_a8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_46;
  
  __fd = (int)&local_328;
  __how_01 = (int)&local_328;
  raft_functional_common::reset_log_files();
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"tcp://127.0.0.1:20010","");
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"tcp://127.0.0.1:20020","");
  local_280._0_4_ = 1;
  local_2b8 = (RaftAsioPkg *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RaftAsioPkg,std::allocator<RaftAsioPkg>,int,std::__cxx11::string&>
            (&_Stack_2b0,&local_2b8,(allocator<RaftAsioPkg> *)(local_a8 + 0x10),(int *)local_280,
             &local_160);
  local_280._0_4_ = 2;
  local_2f8 = (RaftAsioPkg *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RaftAsioPkg,std::allocator<RaftAsioPkg>,int,std::__cxx11::string&>
            (&local_2f0,&local_2f8,(allocator<RaftAsioPkg> *)(local_a8 + 0x10),(int *)local_280,
             &local_140);
  local_280 = (undefined1  [8])local_2b8;
  local_278 = (undefined1  [8])local_2f8;
  __l._M_len = 2;
  __l._M_array = (iterator)local_280;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&local_120,__l,(allocator_type *)(local_a8 + 0x10));
  TestSuite::_msg("launching asio-raft servers\n");
  local_280 = (undefined1  [8])((ulong)local_280 & 0xffffffffffffff00);
  local_278 = (undefined1  [8])0x0;
  auStack_270 = (undefined1  [8])0x0;
  local_268._0_8_ = (_Manager_type)0x0;
  local_268._8_8_ = (_Invoker_type)0x0;
  local_258[0]._0_1_ = true;
  local_258[0]._1_1_ = false;
  iVar6 = launch_servers(&local_120,false,false,true,(init_options *)local_280);
  if ((_Manager_type)local_268._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  if (iVar6 == 0) {
    TestSuite::_msg("organizing raft group\n");
    iVar6 = make_group(&local_120);
    if (iVar6 == 0) {
      local_280 = (undefined1  [8])auStack_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,"wait for Raft group ready","");
      TestSuite::sleep_sec(1,(string *)local_280);
      if (local_280 != (undefined1  [8])auStack_270) {
        operator_delete((void *)local_280);
      }
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      local_d0 = std::
                 _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
                 ::_M_invoke;
      local_d8 = std::
                 _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
                 ::_M_manager;
      nuraft::raft_server::set_inc_term_func
                ((local_2b8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (inc_term_func *)&local_e8);
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
      local_108._M_unused._M_object = (void *)0x0;
      local_108._8_8_ = 0;
      local_f0 = std::
                 _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
                 ::_M_manager;
      nuraft::raft_server::set_inc_term_func
                ((local_2f8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (inc_term_func *)&local_108);
      if (local_f8 != (code *)0x0) {
        (*local_f8)(&local_108,&local_108,__destroy_functor);
      }
      nuraft::raft_server::get_current_params
                ((raft_params *)(local_a8 + 0x10),
                 (local_2b8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_46 = '\x01';
      nuraft::raft_server::update_params
                ((local_2b8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (raft_params *)(local_a8 + 0x10));
      nuraft::raft_server::update_params
                ((local_2f8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (raft_params *)(local_a8 + 0x10));
      peVar3 = (local_2b8->raftServer).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
         ((peVar3->role_)._M_i == leader)) {
        peVar3 = (local_2b8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
            (iVar6 = -1, (peVar3->role_)._M_i != leader)) ||
           (iVar6 = (peVar3->leader_).super___atomic_base<int>._M_i, iVar6 != 1)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_280,(long)local_278);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          lVar2 = *(long *)poVar7;
          *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
          if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar10);
            poVar10[0xe1] = (ostream)0x1;
          }
          poVar10[0xe0] = (ostream)0x30;
          local_328._0_8_ = pthread_self();
          std::_Hash_bytes(&local_328,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"auto_quorum_size_election_test",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x407);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"    value of: \x1b[1;34ms1->raftServer->get_leader()\x1b[0m\n",0x36);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          if (local_280 != (undefined1  [8])auStack_270) {
            operator_delete((void *)local_280);
          }
          iVar6 = -1;
          TestSuite::failHandler();
          goto LAB_0019a9fd;
        }
        peVar3 = (local_2f8->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
            (iVar6 = -1, (peVar3->role_)._M_i != leader)) ||
           (iVar6 = (peVar3->leader_).super___atomic_base<int>._M_i, iVar6 != 1)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_280,(long)local_278);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          lVar2 = *(long *)poVar7;
          *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
          if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar10);
            poVar10[0xe1] = (ostream)0x1;
          }
          poVar10[0xe0] = (ostream)0x30;
          local_328._0_8_ = pthread_self();
          std::_Hash_bytes(&local_328,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"auto_quorum_size_election_test",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x408);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n",0x36);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          if (local_280 != (undefined1  [8])auStack_270) {
            operator_delete((void *)local_280);
          }
          iVar6 = -1;
          TestSuite::failHandler();
          goto LAB_0019a9fd;
        }
        __val = 0;
        do {
          local_280 = (undefined1  [8])auStack_270;
          std::__cxx11::string::_M_construct((ulong)local_280,'\x01');
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_280,local_278._0_4_,__val);
          nuraft::buffer::alloc((buffer *)&local_2d0,(size_t)((long)local_278 + 4));
          nuraft::buffer_serializer::buffer_serializer
                    ((buffer_serializer *)&local_328,(ptr<buffer> *)&local_2d0,LITTLE);
          nuraft::buffer_serializer::put_str((buffer_serializer *)&local_328,(string *)local_280);
          peVar3 = (local_2b8->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_2d0.
               super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2d0.
                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_2d0.
              super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_2d0.
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_2d0.
                           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_2d0.
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_2d0.
                           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
            }
          }
          __l_00._M_len = 1;
          __l_00._M_array = &local_2e8;
          std::
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    *)&local_2a8,__l_00,(allocator_type *)&local_290);
          nuraft::raft_server::append_entries
                    ((raft_server *)local_a8,
                     (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      *)peVar3);
          if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          std::
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                     *)&local_2a8);
          if (local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_2d0.
              super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_2d0.
                       super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (local_280 != (undefined1  [8])auStack_270) {
            operator_delete((void *)local_280);
          }
          __val = __val + 1;
        } while (__val != 10);
        local_280 = (undefined1  [8])auStack_270;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_280,"wait for replication","");
        TestSuite::sleep_sec(1,(string *)local_280);
        if (local_280 != (undefined1  [8])auStack_270) {
          operator_delete((void *)local_280);
        }
        with = (TestSm *)
               (local_2b8->sm).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
        bVar5 = raft_functional_common::TestSm::isSame
                          ((TestSm *)
                           (local_2f8->sm).
                           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,with,false);
        if (bVar5) {
          nuraft::raft_server::shutdown
                    ((local_2b8->raftServer).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (int)with,__how);
          this._M_pi = _Stack_2b0._M_pi;
          local_2b8 = (RaftAsioPkg *)0x0;
          _Stack_2b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
          local_280 = (undefined1  [8])auStack_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"wait for quorum adjust","");
          TestSuite::sleep_ms(5000,(string *)local_280);
          if (local_280 != (undefined1  [8])auStack_270) {
            operator_delete((void *)local_280);
          }
          peVar3 = (local_2f8->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
             ((peVar3->role_)._M_i == leader)) {
            peVar3 = (local_2f8->raftServer).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if ((((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
                (iVar6 = -1, (peVar3->role_)._M_i != leader)) ||
               (iVar6 = (peVar3->leader_).super___atomic_base<int>._M_i, iVar6 != 2)) {
              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
              TestSuite::getTimeString_abi_cxx11_();
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(char *)local_280,(long)local_278);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
              lVar2 = *(long *)poVar7;
              *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
              poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
              if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                std::ios::widen((char)poVar10);
                poVar10[0xe1] = (ostream)0x1;
              }
              poVar10[0xe0] = (ostream)0x30;
              local_328._0_8_ = pthread_self();
              std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)&local_2a8,(id *)&local_328);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"auto_quorum_size_election_test",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                         ,0x6b);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x421);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n",0x36
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    expected: \x1b[1;32m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"      actual: \x1b[1;31m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              if (local_280 != (undefined1  [8])auStack_270) {
                operator_delete((void *)local_280);
              }
              iVar6 = -1;
              TestSuite::failHandler();
            }
            else {
              _Var8 = (((local_2f8->raftServer).
                        super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
              std::__cxx11::to_string((string *)local_280,10);
              nuraft::buffer::alloc((buffer *)&local_2d0,(size_t)((long)local_278 + 4));
              nuraft::buffer_serializer::buffer_serializer
                        ((buffer_serializer *)&local_328,(ptr<buffer> *)&local_2d0,LITTLE);
              nuraft::buffer_serializer::put_str
                        ((buffer_serializer *)&local_328,(string *)local_280);
              peVar3 = (local_2f8->raftServer).
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   local_2d0.
                   super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_2d0.
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_2d0.
                  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_2d0.
                          super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_2d0.
                               super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_2d0.
                          super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_2d0.
                               super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              __l_01._M_len = 1;
              __l_01._M_array = &local_2e8;
              std::
              vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        *)&local_2a8,__l_01,(allocator_type *)&local_290);
              nuraft::raft_server::append_entries
                        ((raft_server *)(local_c8 + 0x10),
                         (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)peVar3);
              if (local_b0._M_id._M_thread != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_id._M_thread)
                ;
              }
              std::
              vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                         *)&local_2a8);
              if (local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2e8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_2d0.
                  super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_2d0.
                           super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (local_280 != (undefined1  [8])auStack_270) {
                operator_delete((void *)local_280);
              }
              local_280 = (undefined1  [8])auStack_270;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_280,"wait for replication","");
              TestSuite::sleep_sec(1,(string *)local_280);
              if (local_280 != (undefined1  [8])auStack_270) {
                operator_delete((void *)local_280);
              }
              _Var1 = _Var8 + 1;
              if (_Var1 == (((local_2f8->raftServer).
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->sm_commit_index_).super___atomic_base<unsigned_long>._M_i) {
                TestSuite::_msg("launching S1 again\n");
                local_280._0_4_ = 1;
                local_278 = (undefined1  [8])(auStack_270 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_278,local_160._M_dataplus._M_p,
                           local_160._M_dataplus._M_p +
                           (long)(_func_int ***)local_160._M_string_length);
                memset(local_258,0,0xd0);
                local_188._0_1_ = true;
                local_188._1_1_ = false;
                local_186 = false;
                local_180 = (element_type *)0x0;
                _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_170 = (element_type *)0x0;
                _Stack_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                __l_02._M_len = 1;
                __l_02._M_array = (iterator)&local_2d0;
                local_2d0.
                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_280;
                std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
                          ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&local_2a8,
                           __l_02,(allocator_type *)&local_2e8);
                local_328._0_8_ = local_328._0_8_ & 0xffffffffffffff00;
                local_328.raft_callback_.super__Function_base._M_functor._M_unused._M_object =
                     (buffer *)0x0;
                local_328.raft_callback_.super__Function_base._M_functor._8_8_ = 0;
                local_328.raft_callback_.super__Function_base._M_manager = (code *)0x0;
                local_328.raft_callback_._M_invoker = (_Invoker_type)0x0;
                local_328.start_server_in_constructor_ = true;
                local_328.test_mode_flag_ = false;
                iVar6 = launch_servers((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                                       &local_2a8,false,false,true,&local_328);
                if (local_328.raft_callback_.super__Function_base._M_manager != (code *)0x0) {
                  (*local_328.raft_callback_.super__Function_base._M_manager)
                            ((_Any_data *)&local_328.raft_callback_,
                             (_Any_data *)&local_328.raft_callback_,__destroy_functor);
                }
                if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_2a8._0_8_);
                }
                if (iVar6 == 0) {
                  puVar4 = (undefined1 *)
                           ((long)local_328.raft_callback_.super__Function_base._M_functor.
                                  _M_pod_data + 8);
                  local_328._0_8_ = puVar4;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_328,"wait for S2 ready","");
                  TestSuite::sleep_sec(1,(string *)&local_328);
                  if ((undefined1 *)local_328._0_8_ != puVar4) {
                    operator_delete((void *)local_328._0_8_);
                  }
                  if (_Var1 == (local_218->sm_commit_index_).super___atomic_base<unsigned_long>._M_i
                     ) {
                    peVar3 = (local_2f8->raftServer).
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    if (((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
                       ((peVar3->role_)._M_i == leader)) {
                      if ((((local_218->leader_).super___atomic_base<int>._M_i == local_218->id_) &&
                          (iVar6 = -1, (local_218->role_)._M_i != leader)) ||
                         (iVar6 = (local_218->leader_).super___atomic_base<int>._M_i, iVar6 != 2)) {
                        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"        time: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar7,(char *)local_328._0_8_,
                                            local_328.raft_callback_.super__Function_base._M_functor
                                            ._M_unused._M_member_pointer);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      thread: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                        lVar2 = *(long *)poVar7;
                        *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                        *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                        poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                        if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                          std::ios::widen((char)poVar10);
                          poVar10[0xe1] = (ostream)0x1;
                        }
                        poVar10[0xe0] = (ostream)0x30;
                        local_2a8._0_8_ = pthread_self();
                        std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          in: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"auto_quorum_size_election_test",0x1e);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"          at: ",0xe);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                   ,0x6b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x43c);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,
                                   "    value of: \x1b[1;34ms1_new.raftServer->get_leader()\x1b[0m\n"
                                   ,0x39);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"    expected: \x1b[1;32m",0x15);
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar7,"      actual: \x1b[1;31m",0x15);
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                        if ((undefined1 *)local_328._0_8_ != puVar4) {
                          operator_delete((void *)local_328._0_8_);
                        }
                        iVar6 = -1;
                        TestSuite::failHandler();
                      }
                      else {
                        peVar3 = (local_2f8->raftServer).
                                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        if ((((peVar3->leader_).super___atomic_base<int>._M_i == peVar3->id_) &&
                            (iVar6 = -1, (peVar3->role_)._M_i != leader)) ||
                           (iVar6 = (peVar3->leader_).super___atomic_base<int>._M_i, iVar6 != 2)) {
                          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"        time: ",0xe);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar7,(char *)local_328._0_8_,
                                              local_328.raft_callback_.super__Function_base.
                                              _M_functor._M_unused._M_member_pointer);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"      thread: ",0xe);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                          lVar2 = *(long *)poVar7;
                          *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                               *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                          *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                          poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                          if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                            std::ios::widen((char)poVar10);
                            poVar10[0xe1] = (ostream)0x1;
                          }
                          poVar10[0xe0] = (ostream)0x30;
                          local_2a8._0_8_ = pthread_self();
                          std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"          in: ",0xe);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"auto_quorum_size_election_test",0x1e);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"          at: ",0xe);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                     ,0x6b);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x43d);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,
                                     "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                     ,0x36);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"    expected: \x1b[1;32m",0x15);
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar7,"      actual: \x1b[1;31m",0x15);
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                          if ((undefined1 *)local_328._0_8_ != puVar4) {
                            operator_delete((void *)local_328._0_8_);
                          }
                          iVar6 = -1;
                          TestSuite::failHandler();
                        }
                        else {
                          std::__cxx11::to_string((string *)&local_328,0xb);
                          nuraft::buffer::alloc
                                    ((buffer *)&local_2e8,
                                     (size_t)(local_328.raft_callback_.super__Function_base.
                                              _M_functor._M_unused._M_member_pointer + 4));
                          nuraft::buffer_serializer::buffer_serializer(&local_2a8,&local_2e8,LITTLE)
                          ;
                          nuraft::buffer_serializer::put_str(&local_2a8,(string *)&local_328);
                          peVar3 = (local_2f8->raftServer).
                                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          local_290.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr = local_2e8.
                                   super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr;
                          local_290.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi =
                               local_2e8.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                          if (local_2e8.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              (local_2e8.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count =
                                   (local_2e8.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              (local_2e8.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count =
                                   (local_2e8.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                            }
                          }
                          __l_03._M_len = 1;
                          __l_03._M_array = &local_290;
                          std::
                          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          ::vector(&local_2d0,__l_03,&local_2d1);
                          nuraft::raft_server::append_entries
                                    ((raft_server *)local_c8,
                                     (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                      *)peVar3);
                          if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_c8._8_8_);
                          }
                          std::
                          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          ::~vector(&local_2d0);
                          if (local_290.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_290.
                                       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
                          }
                          if (local_2e8.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_2e8.
                                       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
                          }
                          if ((undefined1 *)local_328._0_8_ != puVar4) {
                            operator_delete((void *)local_328._0_8_);
                          }
                          local_328._0_8_ = puVar4;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_328,"wait for replication","");
                          TestSuite::sleep_sec(1,(string *)&local_328);
                          iVar6 = extraout_EDX;
                          if ((undefined1 *)local_328._0_8_ != puVar4) {
                            operator_delete((void *)local_328._0_8_);
                            iVar6 = extraout_EDX_00;
                          }
                          _Var8 = _Var8 + 2;
                          if (_Var8 == (local_218->sm_commit_index_).
                                       super___atomic_base<unsigned_long>._M_i) {
                            if (_Var8 == (((local_2f8->raftServer).
                                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->sm_commit_index_).
                                         super___atomic_base<unsigned_long>._M_i) {
                              nuraft::raft_server::shutdown
                                        ((local_2f8->raftServer).
                                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,__fd,iVar6);
                              nuraft::raft_server::shutdown(local_218,__fd,__how_00);
                              local_328._0_8_ = puVar4;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_328,"shutting down","");
                              TestSuite::sleep_sec(1,(string *)&local_328);
                              pcVar9 = (char *)local_328._0_8_;
                              if ((undefined1 *)local_328._0_8_ != puVar4) {
                                operator_delete((void *)local_328._0_8_);
                              }
                              iVar6 = 0;
                              SimpleLogger::shutdown((int)pcVar9,__how_01);
                            }
                            else {
                              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"        time: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;30m",7);
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar7,(char *)local_328._0_8_,
                                                  local_328.raft_callback_.super__Function_base.
                                                  _M_functor._M_unused._M_member_pointer);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      thread: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[33m",5);
                              lVar2 = *(long *)poVar7;
                              *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5
                                   | 8;
                              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                              poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                              if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                                std::ios::widen((char)poVar10);
                                poVar10[0xe1] = (ostream)0x1;
                              }
                              poVar10[0xe0] = (ostream)0x30;
                              local_2a8._0_8_ = pthread_self();
                              std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                   0xffffffb5 | 2;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          in: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[36m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"auto_quorum_size_election_test",0x1e);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"()\x1b[0m",6);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"          at: ",0xe);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[32m",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                         ,0x6b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m:",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[1;35m",7);
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x44d);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,
                                         "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                                         ,0x41);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"    expected: \x1b[1;32m",0x15);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"      actual: \x1b[1;31m",0x15);
                              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar7,"\x1b[0m\n",5);
                              if ((undefined1 *)local_328._0_8_ != puVar4) {
                                operator_delete((void *)local_328._0_8_);
                              }
                              iVar6 = -1;
                              TestSuite::failHandler();
                            }
                          }
                          else {
                            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"        time: ",0xe);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"\x1b[1;30m",7);
                            TestSuite::getTimeString_abi_cxx11_();
                            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar7,(char *)local_328._0_8_,
                                                local_328.raft_callback_.super__Function_base.
                                                _M_functor._M_unused._M_member_pointer);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"      thread: ",0xe);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                            lVar2 = *(long *)poVar7;
                            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 |
                                 8;
                            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                            poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                            if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                              std::ios::widen((char)poVar10);
                              poVar10[0xe1] = (ostream)0x1;
                            }
                            poVar10[0xe0] = (ostream)0x30;
                            local_2a8._0_8_ = pthread_self();
                            std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                            *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                                 *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"          in: ",0xe);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"auto_quorum_size_election_test",0x1e);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"          at: ",0xe);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                       ,0x6b);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"\x1b[1;35m",7);
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,1099);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,
                                       "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                                       ,0x44);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"    expected: \x1b[1;32m",0x15);
                            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar7,"      actual: \x1b[1;31m",0x15);
                            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5)
                            ;
                            if ((undefined1 *)local_328._0_8_ != puVar4) {
                              operator_delete((void *)local_328._0_8_);
                            }
                            iVar6 = -1;
                            TestSuite::failHandler();
                          }
                        }
                      }
                    }
                    else {
                      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"        time: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar7,(char *)local_328._0_8_,
                                          local_328.raft_callback_.super__Function_base._M_functor.
                                          _M_unused._M_member_pointer);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"      thread: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                      lVar2 = *(long *)poVar7;
                      *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                           *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                      *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                      poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                      if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                        std::ios::widen((char)poVar10);
                        poVar10[0xe1] = (ostream)0x1;
                      }
                      poVar10[0xe0] = (ostream)0x30;
                      local_2a8._0_8_ = pthread_self();
                      std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) &
                           0xffffffb5 | 2;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"          in: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"auto_quorum_size_election_test",0x1e);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"          at: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                 ,0x6b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x43b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,
                                 "    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n",0x35
                                );
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"    expected: \x1b[1;32m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,"      actual: \x1b[1;31m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                      if ((undefined1 *)local_328._0_8_ != puVar4) {
                        operator_delete((void *)local_328._0_8_);
                      }
                      iVar6 = -1;
                      TestSuite::failHandler();
                    }
                  }
                  else {
                    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar7,(char *)local_328._0_8_,
                                        local_328.raft_callback_.super__Function_base._M_functor.
                                        _M_unused._M_member_pointer);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                    lVar2 = *(long *)poVar7;
                    *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                    poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                    if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                      std::ios::widen((char)poVar10);
                      poVar10[0xe1] = (ostream)0x1;
                    }
                    poVar10[0xe0] = (ostream)0x30;
                    local_2a8._0_8_ = pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"auto_quorum_size_election_test",0x1e);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                               ,0x6b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x438);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                               ,0x44);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"    expected: \x1b[1;32m",0x15);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,"      actual: \x1b[1;31m",0x15);
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                    if ((undefined1 *)local_328._0_8_ != puVar4) {
                      operator_delete((void *)local_328._0_8_);
                    }
                    iVar6 = -1;
                    TestSuite::failHandler();
                  }
                }
                else {
                  poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar7,(char *)local_328._0_8_,
                                      local_328.raft_callback_.super__Function_base._M_functor.
                                      _M_unused._M_member_pointer);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                  lVar2 = *(long *)poVar7;
                  *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                       *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                  *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                  poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                  if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                    std::ios::widen((char)poVar10);
                    poVar10[0xe1] = (ostream)0x1;
                  }
                  poVar10[0xe0] = (ostream)0x30;
                  local_2a8._0_8_ = pthread_self();
                  std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)&local_2d0,(id *)&local_2a8);
                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 |
                       2;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"auto_quorum_size_election_test",0x1e);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                             ,0x6b);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x435);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,
                             "    value of: \x1b[1;34mlaunch_servers({&s1_new}, false)\x1b[0m\n",
                             0x3a);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"    expected: \x1b[1;32m",0x15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"      actual: \x1b[1;31m",0x15);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                  if ((undefined1 *)local_328._0_8_ !=
                      (undefined1 *)
                      ((long)local_328.raft_callback_.super__Function_base._M_functor._M_pod_data +
                      8U)) {
                    operator_delete((void *)local_328._0_8_);
                  }
                  iVar6 = -1;
                  TestSuite::failHandler();
                }
                RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_280);
              }
              else {
                poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
                TestSuite::getTimeString_abi_cxx11_();
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_280,(long)local_278);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
                lVar2 = *(long *)poVar7;
                *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
                *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
                if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
                  std::ios::widen((char)poVar10);
                  poVar10[0xe1] = (ostream)0x1;
                }
                poVar10[0xe0] = (ostream)0x30;
                local_328._0_8_ = pthread_self();
                std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)&local_2a8,(id *)&local_328);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"auto_quorum_size_election_test",0x1e);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                           ,0x6b);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x430);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                           ,0x41);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"    expected: \x1b[1;32m",0x15);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"      actual: \x1b[1;31m",0x15);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
                if (local_280 != (undefined1  [8])auStack_270) {
                  operator_delete((void *)local_280);
                }
                iVar6 = -1;
                TestSuite::failHandler();
              }
            }
            goto LAB_0019a9fd;
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_280,(long)local_278);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          lVar2 = *(long *)poVar7;
          *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
          if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar10);
            poVar10[0xe1] = (ostream)0x1;
          }
          poVar10[0xe0] = (ostream)0x30;
          local_328._0_8_ = pthread_self();
          std::_Hash_bytes(&local_328,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"auto_quorum_size_election_test",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x420);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n",0x35);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        }
        else {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_280,(long)local_278);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          lVar2 = *(long *)poVar7;
          *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
          if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar10);
            poVar10[0xe1] = (ostream)0x1;
          }
          poVar10[0xe0] = (ostream)0x30;
          local_328._0_8_ = pthread_self();
          std::_Hash_bytes(&local_328,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
               *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"auto_quorum_size_election_test",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x415);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "    value of: \x1b[1;34ms2->getTestSm()->isSame( *s1->getTestSm() )\x1b[0m\n",
                     0x45);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        }
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_280,(long)local_278);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        lVar2 = *(long *)poVar7;
        *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
        poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
        if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar10);
          poVar10[0xe1] = (ostream)0x1;
        }
        poVar10[0xe0] = (ostream)0x30;
        local_328._0_8_ = pthread_self();
        std::_Hash_bytes(&local_328,8,0xc70f6907);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"auto_quorum_size_election_test",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x406);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34ms1->raftServer->is_leader()\x1b[0m\n",0x35);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      }
      if (local_280 != (undefined1  [8])auStack_270) {
        operator_delete((void *)local_280);
      }
      iVar6 = -1;
      TestSuite::failHandler();
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_280,(long)local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
      lVar2 = *(long *)poVar7;
      *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
      poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
      if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar10);
        poVar10[0xe1] = (ostream)0x1;
      }
      poVar10[0xe0] = (ostream)0x30;
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pthread_self();
      std::_Hash_bytes(local_a8 + 0x10,8,0xc70f6907);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"auto_quorum_size_election_test",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3f7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      if (local_280 != (undefined1  [8])auStack_270) {
        operator_delete((void *)local_280);
      }
      iVar6 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_280,(long)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
    lVar2 = *(long *)poVar7;
    *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar10 = poVar7 + *(long *)(lVar2 + -0x18);
    if (poVar7[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar10);
      poVar10[0xe1] = (ostream)0x1;
    }
    poVar10[0xe0] = (ostream)0x30;
    local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pthread_self();
    std::_Hash_bytes(local_a8 + 0x10,8,0xc70f6907);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"auto_quorum_size_election_test",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3f4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    if (local_280 != (undefined1  [8])auStack_270) {
      operator_delete((void *)local_280);
    }
    iVar6 = -1;
    TestSuite::failHandler();
  }
LAB_0019a9fd:
  if (local_120.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0._M_pi);
  }
  if (_Stack_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2b0._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return iVar6;
}

Assistant:

int auto_quorum_size_election_test() {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";

    std::shared_ptr<RaftAsioPkg> s1 = std::make_shared<RaftAsioPkg>(1, s1_addr);
    std::shared_ptr<RaftAsioPkg> s2 = std::make_shared<RaftAsioPkg>(2, s2_addr);
    std::vector<RaftAsioPkg*> pkgs = {s1.get(), s2.get()};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set custom term counter, and enable auto quorum size mode.
    auto custom_inc_term = [](uint64_t cur_term) -> uint64_t {
        return (cur_term / 10) + 10;
    };
    s1->raftServer->set_inc_term_func(custom_inc_term);
    s2->raftServer->set_inc_term_func(custom_inc_term);

    raft_params params = s1->raftServer->get_current_params();
    params.auto_adjust_quorum_for_small_cluster_ = true;
    s1->raftServer->update_params(params);
    s2->raftServer->update_params(params);

    CHK_TRUE( s1->raftServer->is_leader() );
    CHK_EQ(1, s1->raftServer->get_leader());
    CHK_EQ(1, s2->raftServer->get_leader());

    // Replication.
    for (size_t ii=0; ii<10; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1->raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2->getTestSm()->isSame( *s1->getTestSm() ) );

    // Shutdown S1.
    s1->raftServer->shutdown();
    s1.reset();

    // Wait for adjust quorum and self election.
    TestSuite::sleep_ms( RaftAsioPkg::HEARTBEAT_MS * 50,
                         "wait for quorum adjust" );

    // S2 should be a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s2->raftServer->get_leader());
    uint64_t committed_idx = s2->raftServer->get_committed_log_idx();

    // More replication.
    for (size_t ii=10; ii<11; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Replication should succeed: committed index should be moved forward.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 1,
            s2->raftServer->get_committed_log_idx() );

    // Restart S1.
    _msg("launching S1 again\n");
    RaftAsioPkg s1_new(1, s1_addr);
    CHK_Z( launch_servers({&s1_new}, false) );
    TestSuite::sleep_sec(1, "wait for S2 ready");
    CHK_EQ( committed_idx + 1,
            s1_new.raftServer->get_committed_log_idx() );

    // S2 should remain as a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s1_new.raftServer->get_leader());
    CHK_EQ(2, s2->raftServer->get_leader());

    // More replication.
    for (size_t ii=11; ii<12; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Both of them should have the same commit number.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 2,
            s1_new.raftServer->get_committed_log_idx() );
    CHK_EQ( committed_idx + 2,
            s2->raftServer->get_committed_log_idx() );

    s2->raftServer->shutdown();
    s1_new.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}